

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pointer.cpp
# Opt level: O2

void __thiscall duckdb::DataPointer::DataPointer(DataPointer *this,DataPointer *other)

{
  CompressionType CVar1;
  uint64_t uVar2;
  block_id_t bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  BlockPointer __tmp;
  
  (this->block_pointer).block_id = -1;
  (this->block_pointer).offset = 0;
  (this->block_pointer).unused_padding = 0;
  BaseStatistics::BaseStatistics(&this->statistics,&other->statistics);
  (this->segment_state).
  super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
  .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl =
       (ColumnSegmentState *)0x0;
  uVar2 = this->row_start;
  this->row_start = other->row_start;
  other->row_start = uVar2;
  uVar2 = this->tuple_count;
  this->tuple_count = other->tuple_count;
  other->tuple_count = uVar2;
  bVar3 = (this->block_pointer).block_id;
  uVar6 = (this->block_pointer).offset;
  uVar7 = (this->block_pointer).unused_padding;
  uVar4 = (other->block_pointer).offset;
  uVar5 = (other->block_pointer).unused_padding;
  (this->block_pointer).block_id = (other->block_pointer).block_id;
  (this->block_pointer).offset = uVar4;
  (this->block_pointer).unused_padding = uVar5;
  (other->block_pointer).block_id = bVar3;
  (other->block_pointer).offset = uVar6;
  (other->block_pointer).unused_padding = uVar7;
  CVar1 = this->compression_type;
  this->compression_type = other->compression_type;
  other->compression_type = CVar1;
  ::std::
  swap<duckdb::unique_ptr<duckdb::ColumnSegmentState,std::default_delete<duckdb::ColumnSegmentState>,true>>
            (&this->segment_state,&other->segment_state);
  return;
}

Assistant:

DataPointer::DataPointer(DataPointer &&other) noexcept : statistics(std::move(other.statistics)) {
	std::swap(row_start, other.row_start);
	std::swap(tuple_count, other.tuple_count);
	std::swap(block_pointer, other.block_pointer);
	std::swap(compression_type, other.compression_type);
	std::swap(segment_state, other.segment_state);
}